

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncMax(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  bool bVar2;
  long lVar3;
  anon_union_8_2_b358304e_for_ExpressionValue_1 *paVar4;
  ExpressionValue *result;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1;
  if (lVar3 == 0) {
    bVar2 = true;
    dVar6 = -0.0;
    dVar7 = 2.2250738585072014e-308;
  }
  else {
    dVar5 = -0.0;
    lVar3 = (lVar3 >> 4) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    paVar4 = &pEVar1->field_1;
    bVar2 = true;
    dVar6 = -0.0;
    dVar8 = 2.2250738585072014e-308;
    do {
      if (((ExpressionValue *)(paVar4 + -1))->type == Float) {
        dVar7 = paVar4->floatValue;
        bVar2 = false;
      }
      else {
        if (((ExpressionValue *)(paVar4 + -1))->type != Integer) {
          return __return_storage_ptr__;
        }
        dVar5 = (double)paVar4->intValue;
        dVar7 = (double)(long)dVar5;
      }
      if ((long)dVar6 < (long)dVar5) {
        dVar6 = dVar5;
      }
      if (dVar7 <= dVar8) {
        dVar7 = dVar8;
      }
      paVar4 = paVar4 + 6;
      lVar3 = lVar3 + -1;
      dVar8 = dVar7;
    } while (lVar3 != 0);
  }
  if (!bVar2) {
    dVar6 = dVar7;
  }
  (__return_storage_ptr__->field_1).intValue = (int64_t)dVar6;
  __return_storage_ptr__->type = Float - bVar2;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncMax(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	double floatMax, floatCur;
	int64_t intMax, intCur;

	floatCur = floatMax = std::numeric_limits<double>::min();
	intCur = intMax = std::numeric_limits<int64_t>::min();
	bool isInt = true;

	for (size_t i = 0; i < parameters.size(); i++)
	{
		switch (parameters[i].type)
		{
		case ExpressionValueType::Integer:
			intCur = parameters[i].intValue;
			floatCur = (double)parameters[i].intValue;
			break;
		case ExpressionValueType::Float:
			floatCur = parameters[i].floatValue;
			isInt = false;
			break;
		default:
			return result;
		}

		if (intCur > intMax)
			intMax = intCur;
		if (floatCur > floatMax)
			floatMax = floatCur;
	}

	if (isInt)
	{
		result.intValue = intMax;
		result.type = ExpressionValueType::Integer;
	}
	else
	{
		result.floatValue = floatMax;
		result.type = ExpressionValueType::Float;
	}

	return result;
}